

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O0

void __thiscall cab_session::handle_receive(cab_session *this)

{
  anon_class_24_2_3fe5b907 local_48;
  mutable_buffer local_30;
  undefined1 local_20 [8];
  shared_ptr<cab_session> self;
  cab_session *this_local;
  
  self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::enable_shared_from_this<cab_session>::shared_from_this
            ((enable_shared_from_this<cab_session> *)local_20);
  local_30 = (mutable_buffer)boost::asio::buffer<unsigned_char,1024ul>(&this->_receive_buffer);
  local_48.this = this;
  std::shared_ptr<cab_session>::shared_ptr(&local_48.self,(shared_ptr<cab_session> *)local_20);
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::async_read_some<boost::asio::mutable_buffers_1,cab_session::handle_receive()::__0>
            ((basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->_socket,(mutable_buffers_1 *)&local_30,&local_48);
  handle_receive()::$_0::~__0((__0 *)&local_48);
  std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_20);
  return;
}

Assistant:

void cab_session::handle_receive()
{
    auto self = shared_from_this();
    _socket.async_read_some(boost::asio::buffer(_receive_buffer), [this, self](boost::system::error_code error_code, std::size_t length)
    {
        if(!error_code)
        {
            _buffer.insert(_buffer.end(), _receive_buffer.begin(), _receive_buffer.begin() + length);
            _handle_buffer();
        }
    });
}